

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

BranchInstr * __thiscall
Lowerer::InsertCompareBranch
          (Lowerer *this,Opnd *compareSrc1,Opnd *compareSrc2,OpCode branchOpCode,bool isUnsigned,
          LabelInstr *target,Instr *insertBeforeInstr,bool ignoreNaN)

{
  ushort uVar1;
  Func *func;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  uint uVar5;
  undefined4 *puVar6;
  BranchInstr *pBVar7;
  Opnd *pOVar8;
  uint uVar9;
  
  uVar9 = (uint)branchOpCode;
  if (compareSrc1 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3da0,"(compareSrc1)","compareSrc1");
    if (!bVar3) goto LAB_005beaf5;
    *puVar6 = 0;
  }
  if (compareSrc2 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3da1,"(compareSrc2)","compareSrc2");
    if (!bVar3) goto LAB_005beaf5;
    *puVar6 = 0;
  }
  func = insertBeforeInstr->m_func;
  if ((byte)(compareSrc1->m_type - TyFloat32) < 2) {
    if (1 < (byte)(compareSrc2->m_type - TyFloat32)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3da7,"(compareSrc2->IsFloat())","compareSrc2->IsFloat()");
      if (!bVar3) goto LAB_005beaf5;
      *puVar6 = 0;
    }
    if (!isUnsigned) {
LAB_005be81c:
      pBVar7 = IR::BranchInstr::New(branchOpCode,target,compareSrc1,compareSrc2,func);
      IR::Instr::InsertBefore(insertBeforeInstr,&pBVar7->super_Instr);
      pBVar7 = LowererMD::LowerFloatCondBranch(pBVar7,ignoreNaN);
      return pBVar7;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3da8,"(!isUnsigned)","!isUnsigned");
    if (bVar3) {
      *puVar6 = 0;
      goto LAB_005be81c;
    }
    goto LAB_005beaf5;
  }
  uVar5 = uVar9 - 0xc;
  if (((ushort)uVar5 < 8) && ((0xf3U >> (uVar5 & 0x1f) & 1) != 0)) {
    uVar1 = *(ushort *)(&DAT_010496e0 + (ulong)(uVar5 & 0xffff) * 2);
    OVar4 = IR::Opnd::GetKind(compareSrc1);
    pOVar8 = compareSrc1;
    if (OVar4 == OpndKindIntConst) {
LAB_005be888:
      OVar4 = IR::Opnd::GetKind(compareSrc2);
      if ((OVar4 != OpndKindIntConst) &&
         (OVar4 = IR::Opnd::GetKind(compareSrc2), OVar4 != OpndKindAddr)) {
        uVar9 = (uint)uVar1;
        pOVar8 = compareSrc2;
        compareSrc2 = compareSrc1;
      }
    }
    else {
      OVar4 = IR::Opnd::GetKind(compareSrc1);
      if (OVar4 == OpndKindAddr) {
        OVar4 = IR::Opnd::GetKind(compareSrc1);
        if (OVar4 != OpndKindAddr) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
          if (!bVar3) goto LAB_005beaf5;
          *puVar6 = 0;
        }
        if ((_func_int **)(long)(int)compareSrc1[2]._vptr_Opnd == compareSrc1[2]._vptr_Opnd)
        goto LAB_005be888;
      }
    }
    branchOpCode = (OpCode)uVar9;
    OVar4 = IR::Opnd::GetKind(pOVar8);
    compareSrc1 = pOVar8;
    if (OVar4 == OpndKindReg) {
      OVar4 = IR::Opnd::GetKind(compareSrc2);
      if (OVar4 == OpndKindIntConst) {
        OVar4 = IR::Opnd::GetKind(compareSrc2);
        if (OVar4 != OpndKindIntConst) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
          if (!bVar3) goto LAB_005beaf5;
          *puVar6 = 0;
        }
        if (compareSrc2[1]._vptr_Opnd != (_func_int **)0x0) goto LAB_005be9d8;
        if (branchOpCode == BrGt_A) goto LAB_005beac1;
        if (uVar9 != 0x13) goto LAB_005bea64;
LAB_005beaba:
        branchOpCode = BrLe_A;
      }
      else {
LAB_005be9d8:
        OVar4 = IR::Opnd::GetKind(compareSrc2);
        if (OVar4 == OpndKindAddr) {
          OVar4 = IR::Opnd::GetKind(compareSrc2);
          if (OVar4 != OpndKindAddr) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar6 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
            if (!bVar3) {
LAB_005beaf5:
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *puVar6 = 0;
          }
          if ((branchOpCode != BrGt_A) && (compareSrc2[2]._vptr_Opnd == (_func_int **)0x0)) {
            if (branchOpCode != BrLe_A) {
LAB_005bea64:
              if ((branchOpCode & ~MediumLayoutPrefix) == BrGe_A) {
                if (isUnsigned) goto LAB_005beac1;
                branchOpCode = LowererMD::MDCompareWithZeroBranchOpcode(branchOpCode);
              }
              if ((compareSrc2->field_0xb & 2) == 0) {
                IR::Opnd::Free(compareSrc2,func);
              }
              InsertTest(pOVar8,pOVar8,insertBeforeInstr);
              goto LAB_005bead3;
            }
            goto LAB_005beaba;
          }
        }
      }
    }
  }
LAB_005beac1:
  InsertCompare(compareSrc1,compareSrc2,insertBeforeInstr);
LAB_005bead3:
  pBVar7 = InsertBranch(branchOpCode,isUnsigned,target,insertBeforeInstr);
  return pBVar7;
}

Assistant:

IR::BranchInstr *Lowerer::InsertCompareBranch(
    IR::Opnd *compareSrc1,
    IR::Opnd *compareSrc2,
    Js::OpCode branchOpCode,
    const bool isUnsigned,
    IR::LabelInstr *const target,
    IR::Instr *const insertBeforeInstr,
    const bool ignoreNaN)
{
    Assert(compareSrc1);
    Assert(compareSrc2);

    Func *const func = insertBeforeInstr->m_func;

    if(compareSrc1->IsFloat())
    {
        Assert(compareSrc2->IsFloat());
        Assert(!isUnsigned);
        IR::BranchInstr *const instr = IR::BranchInstr::New(branchOpCode, target, compareSrc1, compareSrc2, func);
        insertBeforeInstr->InsertBefore(instr);
        return LowererMD::LowerFloatCondBranch(instr, ignoreNaN);
    }
#ifdef _M_IX86
    else if (compareSrc1->IsInt64())
    {
        Assert(compareSrc2->IsInt64());
        IR::BranchInstr *const instr = IR::BranchInstr::New(branchOpCode, target, compareSrc1, compareSrc2, func);
        insertBeforeInstr->InsertBefore(instr);
        m_lowererMD.EmitInt64Instr(instr);
        return instr;
    }
#endif

    Js::OpCode swapSrcsBranchOpCode;
    switch(branchOpCode)
    {
        case Js::OpCode::BrEq_A:
        case Js::OpCode::BrNeq_A:
            swapSrcsBranchOpCode = branchOpCode;
            goto Common_BrEqNeqGeGtLeLt;

        case Js::OpCode::BrGe_A:
            swapSrcsBranchOpCode = Js::OpCode::BrLe_A;
            goto Common_BrEqNeqGeGtLeLt;

        case Js::OpCode::BrGt_A:
            swapSrcsBranchOpCode = Js::OpCode::BrLt_A;
            goto Common_BrEqNeqGeGtLeLt;

        case Js::OpCode::BrLe_A:
            swapSrcsBranchOpCode = Js::OpCode::BrGe_A;
            goto Common_BrEqNeqGeGtLeLt;

        case Js::OpCode::BrLt_A:
            swapSrcsBranchOpCode = Js::OpCode::BrGt_A;
            // fall through

        Common_BrEqNeqGeGtLeLt:
            // Check if src1 is a constant and src2 is not, and facilitate folding the constant into the Cmp instruction
            if( (
                    compareSrc1->IsIntConstOpnd() ||
                    (
                        compareSrc1->IsAddrOpnd() &&
                        Math::FitsInDWord(reinterpret_cast<size_t>(compareSrc1->AsAddrOpnd()->m_address))
                    )
                ) &&
                !compareSrc2->IsIntConstOpnd() &&
                !compareSrc2->IsAddrOpnd())
            {
                // Swap the sources and branch
                IR::Opnd *const tempSrc = compareSrc1;
                compareSrc1 = compareSrc2;
                compareSrc2 = tempSrc;
                branchOpCode = swapSrcsBranchOpCode;
            }

            // Check for compare with zero, to prefer using Test instead of Cmp
            if( !compareSrc1->IsRegOpnd() ||
                !(
                    (compareSrc2->IsIntConstOpnd() && compareSrc2->AsIntConstOpnd()->GetValue() == 0) ||
                    (compareSrc2->IsAddrOpnd() && !compareSrc2->AsAddrOpnd()->m_address)
                ) ||
                branchOpCode == Js::OpCode::BrGt_A || branchOpCode == Js::OpCode::BrLe_A)
            {
                goto Default;
            }
            if(branchOpCode == Js::OpCode::BrGe_A || branchOpCode == Js::OpCode::BrLt_A)
            {
                if(isUnsigned)
                {
                    goto Default;
                }
                branchOpCode = LowererMD::MDCompareWithZeroBranchOpcode(branchOpCode);
            }
            if(!compareSrc2->IsInUse())
            {
                compareSrc2->Free(func);
            }
            InsertTest(compareSrc1, compareSrc1, insertBeforeInstr);
            break;

        default:
        Default:
            InsertCompare(compareSrc1, compareSrc2, insertBeforeInstr);
            break;
    }

    return InsertBranch(branchOpCode, isUnsigned, target, insertBeforeInstr);
}